

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifold_test.cpp
# Opt level: O2

void __thiscall
Manifold_MeshRelationRefinePrecision_Test::TestBody(Manifold_MeshRelationRefinePrecision_Test *this)

{
  pointer *__ptr;
  char *pcVar1;
  initializer_list<MeshSize> __l;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_218;
  AssertHelper local_210;
  Manifold csaszar;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_1f8;
  int id;
  AssertionResult gtest_ar;
  uint *local_158;
  pointer puStack_150;
  MeshGL inGL;
  
  Csaszar();
  manifold::Manifold::Manifold(&csaszar,(MeshGLP *)&gtest_ar);
  WithPositionColors((Manifold *)&local_1f8);
  manifold::Manifold::GetMeshGL((int)&inGL);
  manifold::Manifold::~Manifold((Manifold *)&local_1f8);
  manifold::Manifold::~Manifold(&csaszar);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&gtest_ar);
  id = *inGL.runOriginalID.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start;
  gtest_ar.success_ = false;
  gtest_ar._1_7_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  manifold::Manifold::Smooth((MeshGLP *)&csaszar,(vector *)&inGL);
  std::_Vector_base<manifold::Smoothness,_std::allocator<manifold::Smoothness>_>::~_Vector_base
            ((_Vector_base<manifold::Smoothness,_std::allocator<manifold::Smoothness>_> *)&gtest_ar)
  ;
  manifold::Manifold::RefineToTolerance(0.05);
  manifold::Manifold::operator=(&csaszar,(Manifold *)&gtest_ar);
  manifold::Manifold::~Manifold((Manifold *)&gtest_ar);
  local_1f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x14f800000a7c;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0xa7c00000003;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_1f8;
  std::vector<MeshSize,_std::allocator<MeshSize>_>::vector
            ((vector<MeshSize,_std::allocator<MeshSize>_> *)&gtest_ar,__l,
             (allocator_type *)&local_218);
  ExpectMeshes(&csaszar,(vector<MeshSize,_std::allocator<MeshSize>_> *)&gtest_ar);
  std::_Vector_base<MeshSize,_std::allocator<MeshSize>_>::~_Vector_base
            ((_Vector_base<MeshSize,_std::allocator<MeshSize>_> *)&gtest_ar);
  manifold::Manifold::GetMeshGL((int)&gtest_ar);
  local_1f8._M_impl.super__Vector_impl_data._M_start = local_158;
  local_1f8._M_impl.super__Vector_impl_data._M_finish = puStack_150;
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP((MeshGLP<float,_unsigned_int> *)&gtest_ar);
  local_218._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)local_1f8._M_impl.super__Vector_impl_data._M_finish -
        (long)local_1f8._M_impl.super__Vector_impl_data._M_start >> 2);
  local_210.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&gtest_ar,"runOriginalID.size()","1",(unsigned_long *)&local_218,
             (int *)&local_210);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x259,pcVar1);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  testing::internal::CmpHelperEQ<unsigned_int,int>
            ((internal *)&gtest_ar,"runOriginalID[0]","id",
             local_1f8._M_impl.super__Vector_impl_data._M_start,&id);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_218);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/elalish[P]manifold/test/manifold_test.cpp"
               ,0x25a,pcVar1);
    testing::internal::AssertHelper::operator=(&local_210,(Message *)&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    if (local_218._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_218._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_1f8);
  manifold::Manifold::~Manifold(&csaszar);
  manifold::MeshGLP<float,_unsigned_int>::~MeshGLP(&inGL);
  return;
}

Assistant:

TEST(Manifold, MeshRelationRefinePrecision) {
  MeshGL inGL = WithPositionColors(Csaszar()).GetMeshGL();
  const int id = inGL.runOriginalID[0];
  Manifold csaszar = Manifold::Smooth(inGL);

  csaszar = csaszar.RefineToTolerance(0.05);
  ExpectMeshes(csaszar, {{2684, 5368, 3}});
  std::vector<uint32_t> runOriginalID = csaszar.GetMeshGL().runOriginalID;
  EXPECT_EQ(runOriginalID.size(), 1);
  EXPECT_EQ(runOriginalID[0], id);

#ifdef MANIFOLD_EXPORT
  ExportOptions opt;
  opt.mat.roughness = 1;
  opt.mat.colorIdx = 0;
  if (options.exportModels)
    ExportMesh("csaszarSmooth.glb", csaszar.GetMeshGL(), opt);
#endif
}